

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string local_1c08;
  TPZGeoBlend<pzgeom::TPZGeoPrism> local_1be8;
  
  local_1c08._M_dataplus._M_p = (pointer)&local_1c08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c08,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_1c08);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend(&local_1be8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::ClassId(&local_1be8);
  local_1be8.super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoBlend_0188eac8;
  lVar4 = 0x1a20;
  do {
    TPZTransform<double>::~TPZTransform
              ((TPZTransform<double> *)
               ((long)local_1be8.super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.
                      fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + -0x1a0;
  } while (lVar4 != 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c08._M_dataplus._M_p != &local_1c08.field_2) {
    operator_delete(local_1c08._M_dataplus._M_p,local_1c08.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}